

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

StrWriter * __thiscall
moira::StrWriter::operator<<(StrWriter *this,IxMit<(moira::Mode)10,_4> wrapper)

{
  StrWriter *pSVar1;
  char *local_d8;
  undefined1 local_b0 [8];
  anon_class_16_2_f84c6168 outerDisplacement;
  anon_class_40_5_76b1e68d indexRegister;
  anon_class_16_2_5155fd46 baseRegister;
  anon_class_24_3_79b1865b baseDisplacement;
  u32 outer;
  u32 base;
  ushort local_40;
  u16 iis;
  u16 size;
  u16 is;
  u16 bs;
  u16 scale_1;
  u16 lw_1;
  u16 reg_1;
  Int local_30;
  ushort local_2a;
  ushort local_28;
  ushort local_26;
  ushort local_24;
  u16 disp;
  u16 scale;
  u16 lw;
  u16 reg;
  u16 full;
  Ea<(moira::Mode)10,_4> *ea;
  StrWriter *this_local;
  IxMit<(moira::Mode)10,_4> wrapper_local;
  
  disp = (ushort)((wrapper.ea)->ext1 >> 8) & 1;
  _scale = wrapper.ea;
  ea = (Ea<(moira::Mode)10,_4> *)this;
  this_local = (StrWriter *)wrapper.ea;
  if (((wrapper.ea)->ext1 & 0x100) == 0) {
    local_24 = (ushort)((wrapper.ea)->ext1 >> 0xc) & 0xf;
    local_26 = (ushort)((wrapper.ea)->ext1 >> 0xb) & 1;
    local_28 = (ushort)((wrapper.ea)->ext1 >> 9) & 3;
    local_2a = (ushort)(wrapper.ea)->ext1 & 0xff;
    operator<<(this);
    pSVar1 = operator<<(this,"@(");
    Int::Int(&local_30,(int)(char)local_2a);
    operator<<(pSVar1,local_30);
    pSVar1 = operator<<(this,",");
    Rn::Rn((Rn *)&lw_1,(uint)local_24);
    pSVar1 = operator<<(pSVar1,_lw_1);
    if (local_26 == 0) {
      local_d8 = ":w";
    }
    else {
      local_d8 = ":l";
    }
    pSVar1 = operator<<(pSVar1,local_d8);
    Scale::Scale((Scale *)&bs,(uint)local_28);
    pSVar1 = operator<<(pSVar1,_bs);
    operator<<(pSVar1,")");
  }
  else {
    is = (ushort)((wrapper.ea)->ext1 >> 0xc) & 0xf;
    size = (ushort)((wrapper.ea)->ext1 >> 0xb) & 1;
    iis = (ushort)((wrapper.ea)->ext1 >> 9) & 3;
    local_40 = (ushort)((wrapper.ea)->ext1 >> 7) & 1;
    base._2_2_ = (ushort)((wrapper.ea)->ext1 >> 6) & 1;
    base._0_2_ = (ushort)((wrapper.ea)->ext1 >> 4) & 3;
    baseDisplacement.base._4_4_ = (wrapper.ea)->ext2;
    baseDisplacement.base._0_4_ = (wrapper.ea)->ext3;
    baseRegister.this = (StrWriter *)&base;
    baseDisplacement.this = (StrWriter *)((long)&baseDisplacement.base + 4);
    indexRegister.scale = &local_40;
    outerDisplacement.outer = (u32 *)((long)&base + 2);
    indexRegister.this = (StrWriter *)&is;
    indexRegister.reg = &size;
    indexRegister.lw = &iis;
    outerDisplacement.this = (StrWriter *)&baseDisplacement.base;
    local_b0 = (undefined1  [8])this;
    indexRegister.is = (u16 *)this;
    baseRegister.bs = (u16 *)this;
    baseDisplacement.size = (u16 *)this;
    if (((wrapper.ea)->ext1 & 7) == 0) {
      operator<<<(moira::Mode)10,_4>::anon_class_16_2_5155fd46::operator()
                ((anon_class_16_2_5155fd46 *)&indexRegister.scale);
      operator<<(this,"@(");
      operator<<<(moira::Mode)10,_4>::anon_class_24_3_79b1865b::operator()
                ((anon_class_24_3_79b1865b *)&baseRegister.this);
      operator<<<(moira::Mode)10,_4>::anon_class_40_5_76b1e68d::operator()
                ((anon_class_40_5_76b1e68d *)&outerDisplacement.outer);
      operator<<(this,")");
    }
    else if (((wrapper.ea)->ext1 & 4) == 0) {
      operator<<<(moira::Mode)10,_4>::anon_class_16_2_5155fd46::operator()
                ((anon_class_16_2_5155fd46 *)&indexRegister.scale);
      operator<<(this,"@(");
      operator<<<(moira::Mode)10,_4>::anon_class_24_3_79b1865b::operator()
                ((anon_class_24_3_79b1865b *)&baseRegister.this);
      operator<<<(moira::Mode)10,_4>::anon_class_40_5_76b1e68d::operator()
                ((anon_class_40_5_76b1e68d *)&outerDisplacement.outer);
      operator<<(this,")@(");
      operator<<<(moira::Mode)10,_4>::anon_class_16_2_f84c6168::operator()
                ((anon_class_16_2_f84c6168 *)local_b0);
      operator<<(this,")");
    }
    else {
      operator<<<(moira::Mode)10,_4>::anon_class_16_2_5155fd46::operator()
                ((anon_class_16_2_5155fd46 *)&indexRegister.scale);
      operator<<(this,"@(");
      operator<<<(moira::Mode)10,_4>::anon_class_24_3_79b1865b::operator()
                ((anon_class_24_3_79b1865b *)&baseRegister.this);
      operator<<(this,")@(");
      operator<<<(moira::Mode)10,_4>::anon_class_16_2_f84c6168::operator()
                ((anon_class_16_2_f84c6168 *)local_b0);
      operator<<<(moira::Mode)10,_4>::anon_class_40_5_76b1e68d::operator()
                ((anon_class_40_5_76b1e68d *)&outerDisplacement.outer);
      operator<<(this,")");
    }
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(IxMit<M, S> wrapper)
{
    assert(M == Mode(6) || M == Mode(10));

    auto &ea = wrapper.ea;

    u16 full = _______x________ (ea.ext1);

    if (!full) {

        //   15-12   11   10   09   08   07   06   05   04   03   02   01   00
        // --------------------------------------------------------------------
        // | REG   | LW | SCALE   | 0  | DISPLACEMENT                         |
        // --------------------------------------------------------------------

        u16 reg   = xxxx____________ (ea.ext1);
        u16 lw    = ____x___________ (ea.ext1);
        u16 scale = _____xx_________ (ea.ext1);
        u16 disp  = ________xxxxxxxx (ea.ext1);

        M == Mode(10) ? *this << Pc{} : *this << An{ea.reg};
        *this << "@(" << Int{(i8)disp};
        *this << "," << Rn{reg} << (lw ? ":l" : ":w") << Scale{scale} << ")";

    } else {

        //   15-12   11   10   09   08   07   06   05   04   03   02   01   00
        // --------------------------------------------------------------------
        // | REG   | LW | SCALE   | 1  | BS | IS | BD SIZE  | 0  | IIS        |
        // --------------------------------------------------------------------

        u16  reg   = xxxx____________ (ea.ext1);
        u16  lw    = ____x___________ (ea.ext1);
        u16  scale = _____xx_________ (ea.ext1);
        u16  bs    = ________x_______ (ea.ext1);
        u16  is    = _________x______ (ea.ext1);
        u16  size  = __________xx____ (ea.ext1);
        u16  iis   = _____________xxx (ea.ext1);
        u32  base  = ea.ext2;
        u32  outer = ea.ext3;

        auto baseDisplacement = [&]() {
            size == 3 ? (*this << Int{(i32)base}) : (*this << Int{(i16)base});
        };
        auto baseRegister = [&]() {
            if constexpr (M == Mode(10)) {
                bs ? *this << Zpc{} : *this << Pc{};
            } else {
                if (!bs) *this << An{ea.reg};
            }
        };
        auto indexRegister = [&]() {
            if (!is) *this << Sep{} << Rn{reg} << (lw ? ":l" : ":w") << Scale{scale};
        };
        auto outerDisplacement = [&]() {
            *this << Int(outer);
        };

        if (iis == 0) {

            // Memory Indirect Unindexed
            baseRegister();
            *this << "@(";
            baseDisplacement(); indexRegister();
            *this << ")";

        } else if (iis & 0b100) {

            // Memory Indirect Postindexed
            baseRegister();
            *this << "@(";
            baseDisplacement();
            *this << ")@(";
            outerDisplacement(); indexRegister();
            *this << ")";

        } else {

            // Memory Indirect Preindexed
            baseRegister();
            *this << "@(";
            baseDisplacement(); indexRegister();
            *this << ")@(";
            outerDisplacement();
            *this << ")";
        }
    }

    return *this;
}